

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O1

void __thiscall
duckdb::DataTable::LocalAppend
          (DataTable *this,TableCatalogEntry *table,ClientContext *context,
          ColumnDataCollection *collection,
          vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
          *bound_constraints,
          optional_ptr<const_duckdb::vector<duckdb::LogicalIndex,_true>,_true> column_ids)

{
  ColumnDataChunkIterator *pCVar1;
  Value *this_00;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  TransactionData transaction;
  TransactionData transaction_00;
  void *pvVar3;
  ColumnDataCollection *pCVar4;
  int iVar5;
  undefined4 extraout_var;
  const_reference pvVar6;
  ColumnDefinition *pCVar7;
  string *args;
  LogicalType *pLVar8;
  mapped_type *pmVar9;
  type binder_00;
  Binder *pBVar10;
  ParsedExpression *pPVar11;
  ClientContext *pCVar12;
  DataChunk *pDVar13;
  RowGroupCollection *pRVar14;
  Binder *pBVar15;
  PhysicalIndex physical;
  bool bVar16;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  expressions;
  shared_ptr<duckdb::Binder,_true> binder;
  ColumnDataChunkIterator __begin2;
  map<duckdb::PhysicalIndex,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::less<duckdb::PhysicalIndex>,_std::allocator<std::pair<const_duckdb::PhysicalIndex,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
  active_expressions;
  ColumnDataChunkIterator __end2;
  ConstantBinder default_binder;
  DataChunk result;
  ExpressionExecutor expression_executor;
  LocalAppendState append_state;
  optional_ptr<const_duckdb::vector<duckdb::LogicalIndex,_true>,_true> local_468;
  ColumnList *local_460;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_458;
  TableCatalogEntry *local_440;
  ColumnDataCollection *local_438;
  DataTable *local_430;
  undefined1 local_428 [16];
  ColumnDataChunkIterator local_418;
  undefined1 local_378 [8];
  undefined1 local_370 [48];
  void *local_340;
  string local_328;
  ColumnDataChunkIterator local_308;
  LogicalType local_268;
  ConstantBinder local_250;
  DataChunk local_1c8;
  ExpressionExecutor local_188;
  LocalAppendState local_140;
  DataTable *this_01;
  
  local_468.ptr = column_ids.ptr;
  TableAppendState::TableAppendState(&local_140.append_state);
  local_140.constraint_state.
  super_unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>._M_t.
  super___uniq_ptr_impl<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_>.
  super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl =
       (unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>)
       (__uniq_ptr_data<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>,_true,_true>
        )0x0;
  iVar5 = (*(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry
            [0x10])(table);
  this_01 = (DataTable *)CONCAT44(extraout_var,iVar5);
  InitializeLocalAppend(this_01,&local_140,table,context,bound_constraints);
  if ((local_468.ptr == (vector<duckdb::LogicalIndex,_true> *)0x0) ||
     (optional_ptr<const_duckdb::vector<duckdb::LogicalIndex,_true>,_true>::CheckValid(&local_468),
     ((local_468.ptr)->super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>).
     super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
     super__Vector_impl_data._M_start ==
     ((local_468.ptr)->super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>).
     super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
     super__Vector_impl_data._M_finish)) {
    ColumnDataCollection::Chunks((ColumnDataChunkIterationHelper *)&local_250,collection);
    ColumnDataChunkIterationHelper::begin
              ((ColumnDataChunkIterator *)(local_428 + 0x10),
               (ColumnDataChunkIterationHelper *)&local_250);
    ColumnDataChunkIterationHelper::end(&local_308,(ColumnDataChunkIterationHelper *)&local_250);
    pCVar1 = (ColumnDataChunkIterator *)(local_428 + 0x10);
    while (bVar16 = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator!=
                              (pCVar1,&local_308), bVar16) {
      pDVar13 = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator*(pCVar1);
      LocalAppend(this_01,&local_140,context,pDVar13,false);
      ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator++(pCVar1);
    }
    if (local_308.scan_chunk.internal.
        super___shared_ptr<duckdb::DataChunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_308.scan_chunk.internal.
                 super___shared_ptr<duckdb::DataChunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                );
    }
    if ((pointer)local_308.scan_state.column_ids.
                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_308.scan_state.column_ids.
                      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    ::std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)&local_308.scan_state);
    if (local_418.scan_chunk.internal.
        super___shared_ptr<duckdb::DataChunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_418.scan_chunk.internal.
                 super___shared_ptr<duckdb::DataChunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                );
    }
    if ((__node_base_ptr)
        local_418.scan_state.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (__node_base_ptr)0x0) {
      operator_delete(local_418.scan_state.column_ids.
                      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    ::std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)&local_418.scan_state);
    pvVar3 = (void *)CONCAT62(local_250.super_ExpressionBinder.target_type._2_6_,
                              CONCAT11(local_250.super_ExpressionBinder.target_type.physical_type_,
                                       local_250.super_ExpressionBinder.target_type.id_));
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3);
    }
    pRVar14 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->
                        (&(local_140.storage)->row_groups);
    transaction.transaction_id = local_140.append_state.transaction.transaction_id;
    transaction.transaction.ptr = local_140.append_state.transaction.transaction.ptr;
    transaction.start_time = local_140.append_state.transaction.start_time;
    RowGroupCollection::FinalizeAppend(pRVar14,transaction,&local_140.append_state);
  }
  else {
    local_440 = table;
    local_438 = collection;
    local_430 = this_01;
    local_460 = TableCatalogEntry::GetColumns(table);
    local_370._16_8_ = local_370;
    local_370._0_4_ = _S_red;
    local_370._8_8_ = (Binder *)0x0;
    local_370._32_8_ = (pointer)0x0;
    pCVar12 = (ClientContext *)0x0;
    local_370._24_8_ = local_370._16_8_;
    while (local_418.collection = (ColumnDataCollection *)pCVar12,
          optional_ptr<const_duckdb::vector<duckdb::LogicalIndex,_true>,_true>::CheckValid
                    (&local_468),
          pCVar12 < (ClientContext *)
                    ((long)((local_468.ptr)->
                           super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>
                           ).
                           super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)((local_468.ptr)->
                           super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>
                           ).
                           super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3)) {
      optional_ptr<const_duckdb::vector<duckdb::LogicalIndex,_true>,_true>::CheckValid(&local_468);
      pvVar6 = vector<duckdb::LogicalIndex,_true>::operator[]
                         (local_468.ptr,(size_type)local_418.collection);
      pCVar7 = ColumnList::GetColumn(local_460,(LogicalIndex)pvVar6->index);
      args = ColumnDefinition::Name_abi_cxx11_(pCVar7);
      pLVar8 = ColumnDefinition::Type(pCVar7);
      make_uniq<duckdb::BoundReferenceExpression,std::__cxx11::string_const&,duckdb::LogicalType_const&,unsigned_long&>
                ((duckdb *)&local_308,args,pLVar8,(unsigned_long *)(local_428 + 0x10));
      pCVar4 = local_308.collection;
      local_308.collection = (ColumnDataCollection *)0x0;
      local_250.super_ExpressionBinder._vptr_ExpressionBinder =
           (_func_int **)ColumnDefinition::Physical(pCVar7);
      pmVar9 = ::std::
               map<duckdb::PhysicalIndex,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::less<duckdb::PhysicalIndex>,_std::allocator<std::pair<const_duckdb::PhysicalIndex,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
               ::operator[]((map<duckdb::PhysicalIndex,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::less<duckdb::PhysicalIndex>,_std::allocator<std::pair<const_duckdb::PhysicalIndex,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                             *)local_378,(key_type *)&local_250);
      _Var2._M_head_impl =
           (pmVar9->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
           _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (pmVar9->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)pCVar4;
      if (_Var2._M_head_impl != (Expression *)0x0) {
        (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
      }
      if (local_308.collection != (ColumnDataCollection *)0x0) {
        (*((BaseExpression *)&(local_308.collection)->allocator)->_vptr_BaseExpression[1])();
      }
      pCVar12 = (ClientContext *)
                ((long)&(((Expression *)&(local_418.collection)->allocator)->super_BaseExpression).
                        _vptr_BaseExpression + 1);
    }
    Binder::CreateBinder
              ((Binder *)local_428,context,(optional_ptr<duckdb::Binder,_true>)0x0,REGULAR_BINDER);
    binder_00 = shared_ptr<duckdb::Binder,_true>::operator*
                          ((shared_ptr<duckdb::Binder,_true> *)local_428);
    local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"DEFAULT value","");
    ConstantBinder::ConstantBinder(&local_250,binder_00,context,&local_328);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p);
    }
    local_458.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_458.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_458.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((local_460->physical_columns).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (local_460->physical_columns).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      physical.index = 0;
      do {
        pBVar10 = (Binder *)local_370;
        for (pBVar15 = (Binder *)local_370._8_8_; pBVar15 != (Binder *)0x0;
            pBVar15 = (Binder *)(&pBVar15->context)[bVar16]) {
          bVar16 = (pBVar15->CTE_bindings)._M_h._M_bucket_count < physical.index;
          if (!bVar16) {
            pBVar10 = pBVar15;
          }
        }
        pBVar15 = (Binder *)local_370;
        if ((pBVar10 != (Binder *)local_370) &&
           (pBVar15 = pBVar10, physical.index < (pBVar10->CTE_bindings)._M_h._M_bucket_count)) {
          pBVar15 = (Binder *)local_370;
        }
        if (pBVar15 == (Binder *)local_370) {
          pCVar7 = ColumnList::GetColumn(local_460,physical);
          bVar16 = ColumnDefinition::HasDefaultValue(pCVar7);
          if (bVar16) {
            pPVar11 = ColumnDefinition::DefaultValue(pCVar7);
            (*(pPVar11->super_BaseExpression)._vptr_BaseExpression[0xc])(local_428 + 0x10,pPVar11);
            pLVar8 = ColumnDefinition::Type(pCVar7);
            if (&local_250.super_ExpressionBinder.target_type != pLVar8) {
              local_250.super_ExpressionBinder.target_type.id_ = pLVar8->id_;
              local_250.super_ExpressionBinder.target_type.physical_type_ = pLVar8->physical_type_;
              shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                        (&local_250.super_ExpressionBinder.target_type.type_info_,
                         &pLVar8->type_info_);
            }
            ExpressionBinder::Bind
                      ((ExpressionBinder *)&local_308,
                       (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        *)&local_250,(LogicalType *)(local_428 + 0x10),false);
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                        *)&local_458,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)&local_308);
            if (local_308.collection != (ColumnDataCollection *)0x0) {
              (*((BaseExpression *)&(local_308.collection)->allocator)->_vptr_BaseExpression[1])();
            }
          }
          else {
            pLVar8 = ColumnDefinition::Type(pCVar7);
            LogicalType::LogicalType(&local_268,pLVar8);
            Value::Value((Value *)&local_308,&local_268);
            pCVar12 = (ClientContext *)operator_new(0x98);
            this_00 = (Value *)(local_428 + 0x10);
            Value::Value(this_00,(Value *)&local_308);
            BoundConstantExpression::BoundConstantExpression
                      ((BoundConstantExpression *)pCVar12,this_00);
            Value::~Value(this_00);
            Value::~Value((Value *)&local_308);
            LogicalType::~LogicalType(&local_268);
            local_418.collection = (ColumnDataCollection *)pCVar12;
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                        *)&local_458,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)this_00);
          }
          if ((ClientContext *)local_418.collection != (ClientContext *)0x0) {
            (*(((Expression *)
               &((ClientContext *)local_418.collection)->
                super_enable_shared_from_this<duckdb::ClientContext>)->super_BaseExpression).
              _vptr_BaseExpression[1])();
          }
        }
        else {
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      *)&local_458,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)&(pBVar15->CTE_bindings)._M_h._M_before_begin);
        }
        physical.index = physical.index + 1;
      } while (physical.index <
               (ulong)((long)(local_460->physical_columns).
                             super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(local_460->physical_columns).
                             super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3));
    }
    ExpressionExecutor::ExpressionExecutor
              (&local_188,context,
               (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)&local_458);
    DataChunk::DataChunk(&local_1c8);
    pCVar4 = local_438;
    TableCatalogEntry::GetTypes((vector<duckdb::LogicalType,_true> *)(local_428 + 0x10),local_440);
    DataChunk::Initialize
              (&local_1c8,context,(vector<duckdb::LogicalType,_true> *)(local_428 + 0x10),0x800);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
               (local_428 + 0x10));
    ColumnDataCollection::Chunks((ColumnDataChunkIterationHelper *)(local_370 + 0x28),pCVar4);
    ColumnDataChunkIterationHelper::begin
              ((ColumnDataChunkIterator *)(local_428 + 0x10),
               (ColumnDataChunkIterationHelper *)(local_370 + 0x28));
    ColumnDataChunkIterationHelper::end
              (&local_308,(ColumnDataChunkIterationHelper *)(local_370 + 0x28));
    pCVar1 = (ColumnDataChunkIterator *)(local_428 + 0x10);
    while (bVar16 = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator!=
                              (pCVar1,&local_308), bVar16) {
      pDVar13 = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator*(pCVar1);
      ExpressionExecutor::Execute(&local_188,pDVar13,&local_1c8);
      LocalAppend(local_430,&local_140,context,&local_1c8,false);
      DataChunk::Reset(&local_1c8);
      ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator++(pCVar1);
    }
    if (local_308.scan_chunk.internal.
        super___shared_ptr<duckdb::DataChunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_308.scan_chunk.internal.
                 super___shared_ptr<duckdb::DataChunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                );
    }
    if ((pointer)local_308.scan_state.column_ids.
                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_308.scan_state.column_ids.
                      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    ::std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)&local_308.scan_state);
    if (local_418.scan_chunk.internal.
        super___shared_ptr<duckdb::DataChunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_418.scan_chunk.internal.
                 super___shared_ptr<duckdb::DataChunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                );
    }
    if ((__node_base_ptr)
        local_418.scan_state.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (__node_base_ptr)0x0) {
      operator_delete(local_418.scan_state.column_ids.
                      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    ::std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)&local_418.scan_state);
    if (local_340 != (void *)0x0) {
      operator_delete(local_340);
    }
    pRVar14 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->
                        (&(local_140.storage)->row_groups);
    transaction_00.transaction_id = local_140.append_state.transaction.transaction_id;
    transaction_00.transaction.ptr = local_140.append_state.transaction.transaction.ptr;
    transaction_00.start_time = local_140.append_state.transaction.start_time;
    RowGroupCollection::FinalizeAppend(pRVar14,transaction_00,&local_140.append_state);
    DataChunk::~DataChunk(&local_1c8);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>_>_>
    ::~vector(&local_188.states.
               super_vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>_>_>
             );
    if ((__node_base_ptr)
        local_188.expressions.
        super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
        super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (__node_base_ptr)0x0) {
      operator_delete(local_188.expressions.
                      super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                      .
                      super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector(&local_458);
    local_250.super_ExpressionBinder._vptr_ExpressionBinder =
         (_func_int **)&PTR__ConstantBinder_024797f0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250.clause._M_dataplus._M_p != &local_250.clause.field_2) {
      operator_delete(local_250.clause._M_dataplus._M_p);
    }
    ExpressionBinder::~ExpressionBinder(&local_250.super_ExpressionBinder);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_428._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_428._8_8_);
    }
    ::std::
    _Rb_tree<duckdb::PhysicalIndex,_std::pair<const_duckdb::PhysicalIndex,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>,_std::_Select1st<std::pair<const_duckdb::PhysicalIndex,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>,_std::less<duckdb::PhysicalIndex>,_std::allocator<std::pair<const_duckdb::PhysicalIndex,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
    ::~_Rb_tree((_Rb_tree<duckdb::PhysicalIndex,_std::pair<const_duckdb::PhysicalIndex,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>,_std::_Select1st<std::pair<const_duckdb::PhysicalIndex,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>,_std::less<duckdb::PhysicalIndex>,_std::allocator<std::pair<const_duckdb::PhysicalIndex,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                 *)local_378);
  }
  if (local_140.constraint_state.
      super_unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>._M_t.
      super___uniq_ptr_impl<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_>
      .super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>,_true,_true>
       )0x0) {
    operator_delete((void *)local_140.constraint_state.
                            super_unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_>
                            .super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl);
  }
  local_140.constraint_state.
  super_unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>._M_t.
  super___uniq_ptr_impl<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_>.
  super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl =
       (unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>)
       (__uniq_ptr_data<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>,_true,_true>
        )0x0;
  TableAppendState::~TableAppendState(&local_140.append_state);
  return;
}

Assistant:

void DataTable::LocalAppend(TableCatalogEntry &table, ClientContext &context, ColumnDataCollection &collection,
                            const vector<unique_ptr<BoundConstraint>> &bound_constraints,
                            optional_ptr<const vector<LogicalIndex>> column_ids) {

	LocalAppendState append_state;
	auto &storage = table.GetStorage();
	storage.InitializeLocalAppend(append_state, table, context, bound_constraints);

	if (!column_ids || column_ids->empty()) {
		for (auto &chunk : collection.Chunks()) {
			storage.LocalAppend(append_state, context, chunk, false);
		}
		storage.FinalizeLocalAppend(append_state);
		return;
	}

	auto &column_list = table.GetColumns();
	map<PhysicalIndex, unique_ptr<Expression>> active_expressions;
	for (idx_t i = 0; i < column_ids->size(); i++) {
		auto &col = column_list.GetColumn((*column_ids)[i]);
		auto expr = make_uniq<BoundReferenceExpression>(col.Name(), col.Type(), i);
		active_expressions[col.Physical()] = std::move(expr);
	}

	auto binder = Binder::CreateBinder(context);
	ConstantBinder default_binder(*binder, context, "DEFAULT value");
	vector<unique_ptr<Expression>> expressions;
	for (idx_t i = 0; i < column_list.PhysicalColumnCount(); i++) {
		auto expr = active_expressions.find(PhysicalIndex(i));
		if (expr != active_expressions.end()) {
			expressions.push_back(std::move(expr->second));
			continue;
		}

		auto &col = column_list.GetColumn(PhysicalIndex(i));
		if (!col.HasDefaultValue()) {
			auto null_expr = make_uniq<BoundConstantExpression>(Value(col.Type()));
			expressions.push_back(std::move(null_expr));
			continue;
		}

		auto default_copy = col.DefaultValue().Copy();
		default_binder.target_type = col.Type();
		auto bound_default = default_binder.Bind(default_copy);
		expressions.push_back(std::move(bound_default));
	}

	ExpressionExecutor expression_executor(context, expressions);
	DataChunk result;
	result.Initialize(context, table.GetTypes());

	for (auto &chunk : collection.Chunks()) {
		expression_executor.Execute(chunk, result);
		storage.LocalAppend(append_state, context, result, false);
		result.Reset();
	}
	storage.FinalizeLocalAppend(append_state);
}